

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O1

void emit_header(gif_dest_ptr dinfo,int num_colors,JSAMPARRAY colormap)

{
  uint uVar1;
  jpeg_error_mgr *pjVar2;
  short sVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  
  iVar9 = dinfo->cinfo->data_precision;
  if (0x100 < num_colors) {
    pjVar2 = dinfo->cinfo->err;
    pjVar2->msg_code = 0x413;
    (pjVar2->msg_parm).i[0] = num_colors;
    (*dinfo->cinfo->err->error_exit)((j_common_ptr)dinfo->cinfo);
  }
  bVar4 = (char)iVar9 - 8;
  uVar10 = 0xfffffff0;
  uVar5 = 1;
  do {
    uVar8 = uVar5;
    uVar6 = 1 << ((byte)uVar8 & 0x1f);
    uVar10 = uVar10 + 0x10;
    uVar5 = uVar8 + 1;
  } while ((int)uVar6 < num_colors);
  uVar5 = 2;
  if (2 < uVar8) {
    uVar5 = uVar8;
  }
  putc(0x47,(FILE *)(dinfo->pub).output_file);
  putc(0x49,(FILE *)(dinfo->pub).output_file);
  putc(0x46,(FILE *)(dinfo->pub).output_file);
  putc(0x38,(FILE *)(dinfo->pub).output_file);
  putc(0x37,(FILE *)(dinfo->pub).output_file);
  putc(0x61,(FILE *)(dinfo->pub).output_file);
  uVar1 = dinfo->cinfo->output_width;
  putc(uVar1 & 0xff,(FILE *)(dinfo->pub).output_file);
  putc(uVar1 >> 8 & 0xff,(FILE *)(dinfo->pub).output_file);
  uVar1 = dinfo->cinfo->output_height;
  putc(uVar1 & 0xff,(FILE *)(dinfo->pub).output_file);
  putc(uVar1 >> 8 & 0xff,(FILE *)(dinfo->pub).output_file);
  putc(uVar8 - 1 | uVar10 | 0x80,(FILE *)(dinfo->pub).output_file);
  putc(0,(FILE *)(dinfo->pub).output_file);
  putc(0,(FILE *)(dinfo->pub).output_file);
  if (uVar8 + 1 != 0x20) {
    iVar9 = (num_colors - (num_colors + -1 >> 0x1f)) + -1 >> 1;
    uVar11 = 1;
    if (1 < (int)uVar6) {
      uVar11 = (ulong)uVar6;
    }
    uVar7 = 0;
    do {
      uVar10 = 0x80 >> (bVar4 & 0x1f);
      if ((long)uVar7 < (long)num_colors) {
        if (colormap == (JSAMPARRAY)0x0) {
          uVar10 = iVar9 / (num_colors + -1);
          goto LAB_00107e6e;
        }
        uVar10 = (uint)((*colormap)[uVar7] >> (bVar4 & 0x1f));
        if (dinfo->cinfo->out_color_space == JCS_RGB) {
          putc(uVar10,(FILE *)(dinfo->pub).output_file);
          putc((uint)(colormap[1][uVar7] >> (bVar4 & 0x1f)),(FILE *)(dinfo->pub).output_file);
          putc((uint)(colormap[2][uVar7] >> (bVar4 & 0x1f)),(FILE *)(dinfo->pub).output_file);
        }
        else {
          put_3bytes(dinfo,uVar10);
        }
      }
      else {
LAB_00107e6e:
        put_3bytes(dinfo,uVar10);
      }
      uVar7 = uVar7 + 1;
      iVar9 = iVar9 + 0xff;
    } while (uVar11 != uVar7);
  }
  putc(0x2c,(FILE *)(dinfo->pub).output_file);
  putc(0,(FILE *)(dinfo->pub).output_file);
  putc(0,(FILE *)(dinfo->pub).output_file);
  putc(0,(FILE *)(dinfo->pub).output_file);
  putc(0,(FILE *)(dinfo->pub).output_file);
  uVar10 = dinfo->cinfo->output_width;
  putc(uVar10 & 0xff,(FILE *)(dinfo->pub).output_file);
  putc(uVar10 >> 8 & 0xff,(FILE *)(dinfo->pub).output_file);
  uVar10 = dinfo->cinfo->output_height;
  putc(uVar10 & 0xff,(FILE *)(dinfo->pub).output_file);
  putc(uVar10 >> 8 & 0xff,(FILE *)(dinfo->pub).output_file);
  putc(0,(FILE *)(dinfo->pub).output_file);
  putc(uVar5,(FILE *)(dinfo->pub).output_file);
  dinfo->init_bits = uVar5 + 1;
  dinfo->n_bits = uVar5 + 1;
  dinfo->maxcode = ~(ushort)(-2 << ((byte)uVar5 & 0x1f));
  sVar3 = (short)(1 << ((byte)uVar5 & 0x1f));
  dinfo->ClearCode = sVar3;
  dinfo->EOFCode = sVar3 + 1;
  dinfo->free_code = sVar3 + 2;
  dinfo->code_counter = sVar3 + 2;
  dinfo->first_byte = 1;
  dinfo->bytesinpkt = 0;
  dinfo->cur_accum = 0;
  dinfo->cur_bits = 0;
  if (dinfo->hash_code != (code_int *)0x0) {
    memset(dinfo->hash_code,0,0x2716);
  }
  output(dinfo,dinfo->ClearCode);
  return;
}

Assistant:

LOCAL(void)
emit_header(gif_dest_ptr dinfo, int num_colors, JSAMPARRAY colormap)
/* Output the GIF file header, including color map */
/* If colormap == NULL, synthesize a grayscale colormap */
{
  int BitsPerPixel, ColorMapSize, InitCodeSize, FlagByte;
  int cshift = dinfo->cinfo->data_precision - 8;
  int i;

  if (num_colors > 256)
    ERREXIT1(dinfo->cinfo, JERR_TOO_MANY_COLORS, num_colors);
  /* Compute bits/pixel and related values */
  BitsPerPixel = 1;
  while (num_colors > (1 << BitsPerPixel))
    BitsPerPixel++;
  ColorMapSize = 1 << BitsPerPixel;
  if (BitsPerPixel <= 1)
    InitCodeSize = 2;
  else
    InitCodeSize = BitsPerPixel;
  /*
   * Write the GIF header.
   * Note that we generate a plain GIF87 header for maximum compatibility.
   */
  putc('G', dinfo->pub.output_file);
  putc('I', dinfo->pub.output_file);
  putc('F', dinfo->pub.output_file);
  putc('8', dinfo->pub.output_file);
  putc('7', dinfo->pub.output_file);
  putc('a', dinfo->pub.output_file);
  /* Write the Logical Screen Descriptor */
  put_word(dinfo, (unsigned int)dinfo->cinfo->output_width);
  put_word(dinfo, (unsigned int)dinfo->cinfo->output_height);
  FlagByte = 0x80;              /* Yes, there is a global color table */
  FlagByte |= (BitsPerPixel - 1) << 4; /* color resolution */
  FlagByte |= (BitsPerPixel - 1); /* size of global color table */
  putc(FlagByte, dinfo->pub.output_file);
  putc(0, dinfo->pub.output_file); /* Background color index */
  putc(0, dinfo->pub.output_file); /* Reserved (aspect ratio in GIF89) */
  /* Write the Global Color Map */
  /* If the color map is more than 8 bits precision, */
  /* we reduce it to 8 bits by shifting */
  for (i = 0; i < ColorMapSize; i++) {
    if (i < num_colors) {
      if (colormap != NULL) {
        if (dinfo->cinfo->out_color_space == JCS_RGB) {
          /* Normal case: RGB color map */
          putc(colormap[0][i] >> cshift, dinfo->pub.output_file);
          putc(colormap[1][i] >> cshift, dinfo->pub.output_file);
          putc(colormap[2][i] >> cshift, dinfo->pub.output_file);
        } else {
          /* Grayscale "color map": possible if quantizing grayscale image */
          put_3bytes(dinfo, colormap[0][i] >> cshift);
        }
      } else {
        /* Create a grayscale map of num_colors values, range 0..255 */
        put_3bytes(dinfo, (i * 255 + (num_colors - 1) / 2) / (num_colors - 1));
      }
    } else {
      /* fill out the map to a power of 2 */
      put_3bytes(dinfo, CENTERJSAMPLE >> cshift);
    }
  }
  /* Write image separator and Image Descriptor */
  putc(',', dinfo->pub.output_file); /* separator */
  put_word(dinfo, 0);           /* left/top offset */
  put_word(dinfo, 0);
  put_word(dinfo, (unsigned int)dinfo->cinfo->output_width); /* image size */
  put_word(dinfo, (unsigned int)dinfo->cinfo->output_height);
  /* flag byte: not interlaced, no local color map */
  putc(0x00, dinfo->pub.output_file);
  /* Write Initial Code Size byte */
  putc(InitCodeSize, dinfo->pub.output_file);

  /* Initialize for compression of image data */
  compress_init(dinfo, InitCodeSize + 1);
}